

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::convert_bezier_to_lines(Ref<embree::SceneGraph::Node> *node)

{
  MaterialNode *pMVar1;
  _func_int *p_Var2;
  Node *pNVar3;
  ulong uVar4;
  bool bVar5;
  Ref<embree::SceneGraph::Node> *pRVar6;
  long *plVar7;
  size_type sVar8;
  reference pvVar9;
  _func_int **pp_Var10;
  long *in_RSI;
  Node *in_RDI;
  Hair *hair;
  iterator __end5_1;
  iterator __begin5_1;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *__range5_1;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p;
  iterator __end5;
  iterator __begin5;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *__range5;
  Ref<embree::SceneGraph::HairSetNode> lmesh;
  Ref<embree::SceneGraph::HairSetNode> hmesh;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::MultiTransformNode> xfmNode_1;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  value_type *in_stack_fffffffffffffa38;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_stack_fffffffffffffa40;
  value_type *in_stack_fffffffffffffa48;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_fffffffffffffa50;
  size_t in_stack_fffffffffffffae0;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffae8;
  undefined8 in_stack_fffffffffffffaf0;
  RTCGeometryType type;
  BBox1f time_range;
  HairSetNode *local_4d8;
  long *local_468;
  long *local_408;
  Ref<embree::SceneGraph::Node> *local_3a8;
  Hair local_378;
  Hair local_370;
  Hair local_368;
  reference local_360;
  Hair *local_358;
  __normal_iterator<embree::SceneGraph::HairSetNode::Hair_*,_std::vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>_>
  local_350;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *local_348;
  reference local_340;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *local_338;
  __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
  local_330;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_328;
  undefined1 local_319;
  BBox1f local_318;
  MaterialNode *local_310;
  _func_int **local_308;
  HairSetNode *local_300;
  Node *local_2f8;
  Node *local_2f0;
  ulong local_2e8;
  long *local_2e0;
  long *local_2d8;
  long local_2d0;
  long *local_2c8;
  Node *local_2c0;
  Node *local_2b8;
  
  type = (RTCGeometryType)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
  if (*in_RSI == 0) {
    local_3a8 = (Ref<embree::SceneGraph::Node> *)0x0;
  }
  else {
    local_3a8 = (Ref<embree::SceneGraph::Node> *)
                __dynamic_cast(*in_RSI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (local_3a8 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (**(code **)&local_3a8->ptr->fileName)();
  }
  if (local_3a8 == (Ref<embree::SceneGraph::Node> *)0x0) {
    if (*in_RSI == 0) {
      local_408 = (long *)0x0;
    }
    else {
      local_408 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    local_2c8 = local_408;
    if (local_408 != (long *)0x0) {
      (**(code **)(*local_408 + 0x10))();
    }
    if (local_2c8 == (long *)0x0) {
      if (*in_RSI == 0) {
        local_468 = (long *)0x0;
      }
      else {
        local_468 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      local_2e0 = local_468;
      if (local_468 != (long *)0x0) {
        (**(code **)(*local_468 + 0x10))();
      }
      if (local_2e0 == (long *)0x0) {
        if (*in_RSI == 0) {
          local_4d8 = (HairSetNode *)0x0;
        }
        else {
          local_4d8 = (HairSetNode *)
                      __dynamic_cast(*in_RSI,&Node::typeinfo,&HairSetNode::typeinfo,0);
        }
        local_300 = local_4d8;
        if (local_4d8 != (HairSetNode *)0x0) {
          (*(local_4d8->super_Node).super_RefCount._vptr_RefCount[2])();
        }
        if (local_300 == (HairSetNode *)0x0) {
          bVar5 = false;
        }
        else {
          pp_Var10 = (_func_int **)::operator_new(0x118);
          local_319 = 1;
          time_range = (BBox1f)&local_310;
          pMVar1 = (local_300->material).ptr;
          if (pMVar1 != (MaterialNode *)0x0) {
            pNVar3 = &local_310->super_Node;
            local_310 = pMVar1;
            (*(pNVar3->super_RefCount)._vptr_RefCount[2])();
            pMVar1 = local_310;
          }
          local_310 = pMVar1;
          local_318 = local_300->time_range;
          HairSetNode::HairSetNode
                    (local_300,type,in_stack_fffffffffffffae8,time_range,in_stack_fffffffffffffae0);
          local_319 = 0;
          if (pp_Var10 != (_func_int **)0x0) {
            p_Var2 = *local_308;
            local_308 = pp_Var10;
            (**(code **)(p_Var2 + 0x10))();
            pp_Var10 = local_308;
          }
          local_308 = pp_Var10;
          if (local_310 != (MaterialNode *)0x0) {
            (*(local_310->super_Node).super_RefCount._vptr_RefCount[3])();
          }
          local_328 = &local_300->positions;
          local_330._M_current =
               (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
               std::
               vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ::begin((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        *)in_stack_fffffffffffffa38);
          local_338 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                      std::
                      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ::end((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                             *)in_stack_fffffffffffffa38);
          while (bVar5 = __gnu_cxx::operator!=
                                   ((__normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                                     *)in_stack_fffffffffffffa40,
                                    (__normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                                     *)in_stack_fffffffffffffa38), bVar5) {
            local_340 = __gnu_cxx::
                        __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                        ::operator*(&local_330);
            std::
            vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ::push_back(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
            __gnu_cxx::
            __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
            ::operator++(&local_330);
          }
          local_348 = &local_300->hairs;
          local_350._M_current =
               (Hair *)std::
                       vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                       ::begin((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                *)in_stack_fffffffffffffa38);
          local_358 = (Hair *)std::
                              vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                              ::end((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                     *)in_stack_fffffffffffffa38);
          while (bVar5 = __gnu_cxx::operator!=
                                   ((__normal_iterator<embree::SceneGraph::HairSetNode::Hair_*,_std::vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>_>
                                     *)in_stack_fffffffffffffa40,
                                    (__normal_iterator<embree::SceneGraph::HairSetNode::Hair_*,_std::vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>_>
                                     *)in_stack_fffffffffffffa38), bVar5) {
            local_360 = __gnu_cxx::
                        __normal_iterator<embree::SceneGraph::HairSetNode::Hair_*,_std::vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>_>
                        ::operator*(&local_350);
            HairSetNode::Hair::Hair(&local_368,local_360->vertex,local_360->id);
            std::
            vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            ::push_back(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
            HairSetNode::Hair::Hair(&local_370,local_360->vertex + 1,local_360->id);
            std::
            vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            ::push_back(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
            HairSetNode::Hair::Hair(&local_378,local_360->vertex + 2,local_360->id);
            std::
            vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            ::push_back(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
            __gnu_cxx::
            __normal_iterator<embree::SceneGraph::HairSetNode::Hair_*,_std::vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>_>
            ::operator++(&local_350);
          }
          (in_RDI->super_RefCount)._vptr_RefCount = local_308;
          if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
            (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
          }
          bVar5 = true;
          if (local_308 != (_func_int **)0x0) {
            (**(code **)(*local_308 + 0x18))();
          }
        }
        if (local_300 != (HairSetNode *)0x0) {
          (*(local_300->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        if (!bVar5) goto LAB_001e91e5;
      }
      else {
        for (local_2e8 = 0; uVar4 = local_2e8,
            sVar8 = std::
                    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                            *)(local_2e0 + 0xd)), uVar4 < sVar8; local_2e8 = local_2e8 + 1) {
          pvVar9 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_2e0 + 0xd),local_2e8);
          local_2f8 = pvVar9->ptr;
          if (local_2f8 != (Node *)0x0) {
            (*(local_2f8->super_RefCount)._vptr_RefCount[2])();
          }
          convert_bezier_to_lines(local_3a8);
          pvVar9 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_2e0 + 0xd),local_2e8);
          if (pvVar9->ptr != (Node *)0x0) {
            (*(pvVar9->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          pvVar9->ptr = local_2f0;
          local_2f0 = (Node *)0x0;
          if (local_2f8 != (Node *)0x0) {
            (*(local_2f8->super_RefCount)._vptr_RefCount[3])();
          }
        }
LAB_001e91e5:
        bVar5 = false;
      }
      if (local_2e0 != (long *)0x0) {
        (**(code **)(*local_2e0 + 0x18))();
      }
      if (!bVar5) goto LAB_001e9281;
    }
    else {
      local_2d8 = (long *)local_2c8[0x10];
      if (local_2d8 != (long *)0x0) {
        (**(code **)(*local_2d8 + 0x10))();
      }
      convert_bezier_to_lines(local_3a8);
      plVar7 = local_2c8 + 0x10;
      if (*plVar7 != 0) {
        (**(code **)(*(long *)*plVar7 + 0x18))();
      }
      *plVar7 = local_2d0;
      local_2d0 = 0;
      if (local_2d8 != (long *)0x0) {
        (**(code **)(*local_2d8 + 0x18))();
      }
LAB_001e9281:
      bVar5 = false;
    }
    if (local_2c8 != (long *)0x0) {
      (**(code **)(*local_2c8 + 0x18))();
    }
    if (bVar5) goto LAB_001e932b;
  }
  else {
    local_2c0 = local_3a8[0x13].ptr;
    if (local_2c0 != (Node *)0x0) {
      (*(local_2c0->super_RefCount)._vptr_RefCount[2])();
    }
    convert_bezier_to_lines(local_3a8);
    pRVar6 = local_3a8 + 0x13;
    if (pRVar6->ptr != (Node *)0x0) {
      (*(pRVar6->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pRVar6->ptr = local_2b8;
    local_2b8 = (Node *)0x0;
    if (local_2c0 != (Node *)0x0) {
      (*(local_2c0->super_RefCount)._vptr_RefCount[3])();
    }
  }
  bVar5 = false;
LAB_001e932b:
  if (local_3a8 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (*(code *)(local_3a8->ptr->fileName)._M_string_length)();
  }
  if (!bVar5) {
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)*in_RSI;
    *in_RSI = 0;
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_bezier_to_lines(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_bezier_to_lines(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_bezier_to_lines(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_bezier_to_lines(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::HairSetNode> hmesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      Ref<SceneGraph::HairSetNode> lmesh = new SceneGraph::HairSetNode(RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE, hmesh->material, hmesh->time_range, 0);

      for (auto& p : hmesh->positions)
        lmesh->positions.push_back(p);

      for (auto& hair : hmesh->hairs) {
        lmesh->hairs.push_back(SceneGraph::HairSetNode::Hair(hair.vertex+0,hair.id));
        lmesh->hairs.push_back(SceneGraph::HairSetNode::Hair(hair.vertex+1,hair.id));
        lmesh->hairs.push_back(SceneGraph::HairSetNode::Hair(hair.vertex+2,hair.id));
      }
      return lmesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }